

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

uint64_t __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::get_ext_priority
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *peer)

{
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  unsigned_long *puVar5;
  weak_ptr<libtorrent::aux::peer_connection> local_60;
  peer_connection_handle local_50;
  unsigned_long local_40;
  uint64_t priority;
  shared_ptr<libtorrent::plugin> *e;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *__range4;
  opt_unchoke_candidate *peer_local;
  last_optimistic_unchoke_cmp *this_local;
  
  if (peer->ext_priority == 0xfffffffffffffffe) {
    uVar3 = ::std::numeric_limits<unsigned_long>::max();
    peer->ext_priority = uVar3;
    this_00 = this->plugins;
    __end4 = ::std::
             vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ::begin(this_00);
    e = (shared_ptr<libtorrent::plugin> *)
        ::std::
        vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
        ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                       *)&e), bVar1) {
      priority = (uint64_t)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                 ::operator*(&__end4);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)priority);
      ::std::weak_ptr<libtorrent::aux::peer_connection>::
      weak_ptr<libtorrent::aux::peer_connection,void>(&local_60,peer->peer);
      peer_connection_handle::peer_connection_handle(&local_50,&local_60);
      iVar2 = (*peVar4->_vptr_plugin[10])(peVar4,&local_50);
      peer_connection_handle::~peer_connection_handle(&local_50);
      ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr(&local_60);
      local_40 = CONCAT44(extraout_var,iVar2);
      puVar5 = ::std::min<unsigned_long>(&local_40,&peer->ext_priority);
      peer->ext_priority = *puVar5;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
      ::operator++(&__end4);
    }
  }
  return peer->ext_priority;
}

Assistant:

uint64_t get_ext_priority(opt_unchoke_candidate const& peer) const
			{
#ifndef TORRENT_DISABLE_EXTENSIONS
				if (peer.ext_priority == priority_undetermined)
				{
					peer.ext_priority = std::numeric_limits<uint64_t>::max();
					for (auto& e : plugins)
					{
						uint64_t const priority = e->get_unchoke_priority(peer_connection_handle(*peer.peer));
						peer.ext_priority = std::min(priority, peer.ext_priority);
					}
				}
				return peer.ext_priority;
#else
				TORRENT_UNUSED(peer);
				return std::numeric_limits<uint64_t>::max();
#endif
			}